

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void analyzeDatabase(Parse *pParse,int iDb)

{
  int iStatCur;
  int iTab;
  int iVar1;
  Schema *pSVar2;
  HashElem *pHVar3;
  
  pSVar2 = pParse->db->aDb[iDb].pSchema;
  sqlite3BeginWriteOperation(pParse,0,iDb);
  iStatCur = pParse->nTab;
  pParse->nTab = iStatCur + 3;
  openStatTable(pParse,iDb,iStatCur,(char *)0x0,(char *)0x0);
  pHVar3 = (pSVar2->tblHash).first;
  if (pHVar3 != (HashElem *)0x0) {
    iTab = pParse->nTab;
    iVar1 = pParse->nMem;
    do {
      analyzeOneTable(pParse,(Table *)pHVar3->data,(Index *)0x0,iStatCur,iVar1 + 1,iTab);
      pHVar3 = pHVar3->next;
    } while (pHVar3 != (HashElem *)0x0);
  }
  loadAnalysis(pParse,iDb);
  return;
}

Assistant:

static void analyzeDatabase(Parse *pParse, int iDb){
  sqlite3 *db = pParse->db;
  Schema *pSchema = db->aDb[iDb].pSchema;    /* Schema of database iDb */
  HashElem *k;
  int iStatCur;
  int iMem;
  int iTab;

  sqlite3BeginWriteOperation(pParse, 0, iDb);
  iStatCur = pParse->nTab;
  pParse->nTab += 3;
  openStatTable(pParse, iDb, iStatCur, 0, 0);
  iMem = pParse->nMem+1;
  iTab = pParse->nTab;
  assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
  for(k=sqliteHashFirst(&pSchema->tblHash); k; k=sqliteHashNext(k)){
    Table *pTab = (Table*)sqliteHashData(k);
    analyzeOneTable(pParse, pTab, 0, iStatCur, iMem, iTab);
  }
  loadAnalysis(pParse, iDb);
}